

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CopyClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CopyClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,NameSyntax *args,ExpressionSyntax *args_1)

{
  CopyClassExpressionSyntax *this_00;
  
  this_00 = (CopyClassExpressionSyntax *)allocate(this,0x20,8);
  slang::syntax::CopyClassExpressionSyntax::CopyClassExpressionSyntax(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }